

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::type_id> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::type_id&>(allocator_type<cs_impl::any::holder<cs::type_id>,_64UL,_cs_impl::default_allocator_provider>
                    *this,type_id *args)

{
  long lVar1;
  __int_type_conflict _Var2;
  holder<cs::type_id> *phVar3;
  new_allocator<cs_impl::any::holder<cs::type_id>_> *in_RSI;
  new_allocator<cs_impl::any::holder<cs::type_id>_> *in_RDI;
  holder<cs::type_id> *ptr;
  holder<cs::type_id> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<cs::type_id> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_001d5bf2;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::type_id>_>::allocate(in_RSI,__n,in_RDI)
  ;
LAB_001d5bf2:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::type_id>>::
  construct<cs_impl::any::holder<cs::type_id>,cs::type_id&>
            (in_RDI,in_stack_ffffffffffffffd8,(type_id *)0x1d5c0d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}